

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoserver.hpp
# Opt level: O2

void __thiscall
EOServer::EOServer(EOServer *this,IPAddress addr,unsigned_short port,
                  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
                  *dbinfo,Config *eoserv_config,Config *admin_config)

{
  IPAddress local_e4;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
  local_e0;
  
  local_e4.address = addr.address;
  Server::Server(&this->super_Server,&local_e4,port);
  (this->super_Server)._vptr_Server = (_func_int **)&PTR_ClientFactory_001bc828;
  (this->connection_log)._M_h._M_buckets = &(this->connection_log)._M_h._M_single_bucket;
  (this->connection_log)._M_h._M_bucket_count = 1;
  (this->connection_log)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->connection_log)._M_h._M_element_count = 0;
  (this->connection_log)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  this->QuietConnectionErrors = false;
  this->ping_timer = (TimeEvent *)0x0;
  (this->connection_log)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->connection_log)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->HangupDelay = 10.0;
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>::
  array(&local_e0,dbinfo);
  Initialize(this,&local_e0,eoserv_config,admin_config);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>::
  ~array(&local_e0);
  return;
}

Assistant:

EOServer(IPAddress addr, unsigned short port, std::array<std::string, 6> dbinfo, const Config &eoserv_config, const Config &admin_config) : Server(addr, port)
		{
			this->Initialize(dbinfo, eoserv_config, admin_config);
		}